

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerExceptionManager::cmDebuggerExceptionManager
          (cmDebuggerExceptionManager *this,Session *dapSession)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  allocator<char> local_359;
  key_type local_358;
  allocator<char> local_331;
  key_type local_330;
  allocator<char> local_309;
  key_type local_308;
  allocator<char> local_2e1;
  key_type local_2e0;
  key_type local_2c0;
  undefined1 local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  cmDebuggerExceptionFilter local_2b8;
  key_type local_278;
  undefined1 local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  cmDebuggerExceptionFilter local_270;
  key_type local_230;
  undefined1 local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  cmDebuggerExceptionFilter local_228;
  key_type local_1e8;
  undefined1 local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  cmDebuggerExceptionFilter local_1e0;
  key_type local_1a0;
  undefined1 local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  cmDebuggerExceptionFilter local_198;
  key_type local_158;
  undefined1 local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  cmDebuggerExceptionFilter local_150;
  key_type local_110;
  undefined1 local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  cmDebuggerExceptionFilter local_108;
  key_type local_c8;
  undefined1 local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  cmDebuggerExceptionFilter local_c0;
  key_type local_80;
  undefined1 local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  cmDebuggerExceptionFilter local_78;
  anon_class_8_1_8991fb9c_for_handler local_38 [3];
  anon_class_8_1_8991fb9c_for_handler local_20;
  Session *local_18;
  Session *dapSession_local;
  cmDebuggerExceptionManager *this_local;
  
  this->DapSession = dapSession;
  local_18 = dapSession;
  dapSession_local = (Session *)this;
  std::mutex::mutex(&this->Mutex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::unordered_map(&this->RaiseExceptions);
  std::
  unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
  ::unordered_map(&this->ExceptionMap);
  std::optional<cmDebugger::cmDebuggerException>::optional(&this->TheException);
  local_20.this = this;
  dap::Session::
  registerHandler<cmDebugger::cmDebuggerExceptionManager::cmDebuggerExceptionManager(dap::Session*)::__0,dap::SetExceptionBreakpointsRequest>
            (this->DapSession,&local_20);
  local_38[0].this = this;
  dap::Session::
  registerHandler<cmDebugger::cmDebuggerExceptionManager::cmDebuggerExceptionManager(dap::Session*)::__1,dap::ExceptionInfoRequest>
            (this->DapSession,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"AUTHOR_WARNING",&local_79)
  ;
  local_7b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78.Label,"Warning (dev)",&local_7a);
  local_7b = 0;
  local_80 = AUTHOR_WARNING;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_80);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_78);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_78);
  std::allocator<char>::~allocator(&local_7a);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"AUTHOR_ERROR",&local_c1);
  local_c3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0.Label,"Error (dev)",&local_c2);
  local_c3 = 0;
  local_c8 = AUTHOR_ERROR;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_c8);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_c0);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_c0);
  std::allocator<char>::~allocator(&local_c2);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"FATAL_ERROR",&local_109);
  local_10b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108.Label,"Fatal error",&local_10a);
  local_10b = 0;
  local_110 = FATAL_ERROR;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_110);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_108);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_108);
  std::allocator<char>::~allocator(&local_10a);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"INTERNAL_ERROR",&local_151);
  local_153 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150.Label,"Internal error",&local_152);
  local_153 = 0;
  local_158 = INTERNAL_ERROR;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_158);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_150);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_150);
  std::allocator<char>::~allocator(&local_152);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"MESSAGE",&local_199);
  local_19b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198.Label,"Other messages",&local_19a);
  local_19b = 0;
  local_1a0 = MESSAGE;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_1a0);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_198);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_198);
  std::allocator<char>::~allocator(&local_19a);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"WARNING",&local_1e1);
  local_1e3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0.Label,"Warning",&local_1e2);
  local_1e3 = 0;
  local_1e8 = WARNING;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_1e8);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_1e0);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_1e0);
  std::allocator<char>::~allocator(&local_1e2);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"LOG",&local_229);
  local_22b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228.Label,"Debug log",&local_22a);
  local_22b = 0;
  local_230 = LOG;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_230);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_228);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_228);
  std::allocator<char>::~allocator(&local_22a);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"DEPRECATION_ERROR",&local_271);
  local_273 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270.Label,"Deprecation error",&local_272);
  local_273 = 0;
  local_278 = DEPRECATION_ERROR;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_278);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_270);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_270);
  std::allocator<char>::~allocator(&local_272);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"DEPRECATION_WARNING",&local_2b9);
  local_2bb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8.Label,"Deprecation warning",&local_2ba);
  local_2bb = 0;
  local_2c0 = DEPRECATION_WARNING;
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,&local_2c0);
  cmDebuggerExceptionFilter::operator=(pmVar1,&local_2b8);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter(&local_2b8);
  std::allocator<char>::~allocator(&local_2ba);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"AUTHOR_ERROR",&local_2e1)
  ;
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->RaiseExceptions,&local_2e0);
  *pmVar2 = true;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"FATAL_ERROR",&local_309);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->RaiseExceptions,&local_308);
  *pmVar2 = true;
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"INTERNAL_ERROR",&local_331);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->RaiseExceptions,&local_330);
  *pmVar2 = true;
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"DEPRECATION_ERROR",&local_359);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->RaiseExceptions,&local_358);
  *pmVar2 = true;
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  return;
}

Assistant:

cmDebuggerExceptionManager::cmDebuggerExceptionManager(
  dap::Session* dapSession)
  : DapSession(dapSession)
{
  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_SetExceptionBreakpoints
  DapSession->registerHandler(
    [&](const dap::SetExceptionBreakpointsRequest& request) {
      return HandleSetExceptionBreakpointsRequest(request);
    });

  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_ExceptionInfo
  DapSession->registerHandler([&](const dap::ExceptionInfoRequest& request) {
    (void)request;
    return HandleExceptionInfoRequest();
  });

  ExceptionMap[MessageType::AUTHOR_WARNING] =
    cmDebuggerExceptionFilter{ "AUTHOR_WARNING", "Warning (dev)" };
  ExceptionMap[MessageType::AUTHOR_ERROR] =
    cmDebuggerExceptionFilter{ "AUTHOR_ERROR", "Error (dev)" };
  ExceptionMap[MessageType::FATAL_ERROR] =
    cmDebuggerExceptionFilter{ "FATAL_ERROR", "Fatal error" };
  ExceptionMap[MessageType::INTERNAL_ERROR] =
    cmDebuggerExceptionFilter{ "INTERNAL_ERROR", "Internal error" };
  ExceptionMap[MessageType::MESSAGE] =
    cmDebuggerExceptionFilter{ "MESSAGE", "Other messages" };
  ExceptionMap[MessageType::WARNING] =
    cmDebuggerExceptionFilter{ "WARNING", "Warning" };
  ExceptionMap[MessageType::LOG] =
    cmDebuggerExceptionFilter{ "LOG", "Debug log" };
  ExceptionMap[MessageType::DEPRECATION_ERROR] =
    cmDebuggerExceptionFilter{ "DEPRECATION_ERROR", "Deprecation error" };
  ExceptionMap[MessageType::DEPRECATION_WARNING] =
    cmDebuggerExceptionFilter{ "DEPRECATION_WARNING", "Deprecation warning" };
  RaiseExceptions["AUTHOR_ERROR"] = true;
  RaiseExceptions["FATAL_ERROR"] = true;
  RaiseExceptions["INTERNAL_ERROR"] = true;
  RaiseExceptions["DEPRECATION_ERROR"] = true;
}